

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint * create_return_by_value_constraint(intptr_t value_to_return,size_t size)

{
  void *__dest;
  Constraint *pCVar1;
  CgreenValue local_38;
  
  __dest = malloc(size);
  memcpy(__dest,(void *)value_to_return,size);
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = test_true;
  pCVar1->name = "return by value";
  make_cgreen_by_value(&local_38,__dest,size);
  (pCVar1->expected_value).value_size = local_38.value_size;
  (pCVar1->expected_value).type = local_38.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_38._4_4_;
  (pCVar1->expected_value).value = local_38.value;
  pCVar1->destroy = destroy_by_value_constraint;
  return pCVar1;
}

Assistant:

Constraint *create_return_by_value_constraint(intptr_t value_to_return, size_t size) {
    intptr_t actual_return = (intptr_t) malloc(size);
    memcpy((void*)actual_return, (void*)value_to_return, size);
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &test_true;
    constraint->name = "return by value";
    constraint->expected_value = make_cgreen_by_value((void*)actual_return, size);
    constraint->destroy = &destroy_by_value_constraint;

    return constraint;
}